

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O3

void monster_groups_verify(chunk_conflict *c)

{
  wchar_t wVar1;
  mon_group_list_entry *pmVar2;
  monster *pmVar3;
  angband_constants *paVar4;
  ulong uVar5;
  char *fmt;
  ulong uVar6;
  
  if (z_info->level_monster_max != 0) {
    uVar6 = 0;
    paVar4 = z_info;
    do {
      if (c->monster_groups[uVar6] != (monster_group *)0x0) {
        for (pmVar2 = c->monster_groups[uVar6]->member_list; pmVar2 != (mon_group_list_entry *)0x0;
            pmVar2 = pmVar2->next) {
          pmVar3 = cave_monster(c,pmVar2->midx);
          uVar5 = (ulong)(uint)pmVar3->group_info[0].index;
          if (uVar6 != uVar5) {
            wVar1 = pmVar3->group_info[1].index;
            if ((ulong)(uint)wVar1 == 0) {
              fmt = "Bad group index: group: %d, monster: %d";
            }
            else {
              if (uVar6 != (uint)wVar1) {
                quit_fmt("Bad group index: group: %d, monster: %d",uVar6 & 0xffffffff,
                         (ulong)(uint)wVar1);
              }
              if (pmVar3->group_info[1].role == MON_GROUP_LEADER) goto LAB_00167d02;
              uVar5 = (ulong)(uint)pmVar3->group_info[1].index;
              fmt = "Bad monster role: group: %d, monster: %d";
            }
            quit_fmt(fmt,uVar6 & 0xffffffff,uVar5);
          }
LAB_00167d02:
          paVar4 = z_info;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < paVar4->level_monster_max);
  }
  return;
}

Assistant:

void monster_groups_verify(struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			struct monster_group *group = c->monster_groups[i];
			struct mon_group_list_entry *entry = group->member_list;
			while (entry) {
				struct monster *mon = cave_monster(c, entry->midx);
				struct monster_group_info *info = mon->group_info;
				if (info[PRIMARY_GROUP].index != i) {
					if (info[SUMMON_GROUP].index) {
						if (info[SUMMON_GROUP].index != i) {
							quit_fmt("Bad group index: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
						if (info[SUMMON_GROUP].role != MON_GROUP_LEADER) {
							quit_fmt("Bad monster role: group: %d, monster: %d",
									 i, info[SUMMON_GROUP].index);
						}
					} else {
						quit_fmt("Bad group index: group: %d, monster: %d",
								 i, info[PRIMARY_GROUP].index);
					}
				}
				entry = entry->next;
			}
		}
	}
}